

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O3

void __thiscall Module::clean(Module *this)

{
  long lVar1;
  QList<QUndoStack_*> stacks;
  QArrayData *local_30;
  long local_20;
  
  this->mPermaDirty = false;
  if (this->mModified == true) {
    this->mModified = false;
    modifiedChanged(this,false);
  }
  QUndoGroup::stacks();
  if (local_20 != 0) {
    lVar1 = 0;
    do {
      QUndoStack::setClean();
      lVar1 = lVar1 + 8;
    } while (local_20 << 3 != lVar1);
  }
  if (local_30 != (QArrayData *)0x0) {
    LOCK();
    (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30,8,8);
    }
  }
  return;
}

Assistant:

void Module::clean() {
    mPermaDirty = false;
    if (mModified) {
        mModified = false;
        emit modifiedChanged(false);
    }
    auto const stacks = mUndoGroup->stacks();
    for (auto stack : stacks) {
        stack->setClean();
    }
}